

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json11.cpp
# Opt level: O0

void __thiscall json11::Json::Json(Json *this,string *value)

{
  shared_ptr<json11::JsonString> local_28;
  string *local_18;
  string *value_local;
  Json *this_local;
  
  local_18 = value;
  value_local = (string *)this;
  std::make_shared<json11::JsonString,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_28);
  std::shared_ptr<json11::JsonValue>::shared_ptr<json11::JsonString,void>(&this->m_ptr,&local_28);
  std::shared_ptr<json11::JsonString>::~shared_ptr(&local_28);
  return;
}

Assistant:

Json::Json(string &&value)             : m_ptr(make_shared<JsonString>(move(value))) {}